

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

Scope * __thiscall
ByteCodeGenerator::FindScopeForSym
          (ByteCodeGenerator *this,Scope *symScope,Scope *scope,PropertyId *envIndex,
          FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Scope *pSVar4;
  
  pSVar4 = (Scope *)&this->currentScope;
  if (scope != (Scope *)0x0) {
    pSVar4 = scope;
  }
  while( true ) {
    pSVar4 = pSVar4->enclosingScope;
    if (pSVar4 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x7a7,"(scope)","scope");
      if (bVar2) {
        *puVar3 = 0;
        return (Scope *)0x0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (((pSVar4->func != funcInfo) && ((pSVar4->field_0x44 & 0x10) != 0)) &&
       (pSVar4 != this->globalScope)) {
      *envIndex = *envIndex + 1;
    }
    if (pSVar4 == symScope) break;
    if ((pSVar4->field_0x44 & 1) != 0) {
      return pSVar4;
    }
  }
  return pSVar4;
}

Assistant:

Scope * ByteCodeGenerator::FindScopeForSym(Scope *symScope, Scope *scope, Js::PropertyId *envIndex, FuncInfo *funcInfo) const
{
    for (scope = scope ? scope->GetEnclosingScope() : currentScope; scope; scope = scope->GetEnclosingScope())
    {
        if (scope->GetFunc() != funcInfo
            && scope->GetMustInstantiate()
            && scope != this->globalScope)
        {
            (*envIndex)++;
        }
        if (scope == symScope || scope->GetIsDynamic())
        {
            break;
        }
    }

    Assert(scope);
    return scope;
}